

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
VulkanHppGenerator::gatherResultCodes_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,VulkanHppGenerator *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  pointer ppVar2;
  vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
  *this_00;
  reference pEVar3;
  reference pEVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  allocator<char> local_28d;
  allocator<char> local_28c;
  allocator<char> local_28b;
  allocator<char> local_28a;
  allocator<char> local_289;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  EnumValueAlias ac;
  iterator __end2;
  iterator __begin2;
  vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
  *__range2;
  undefined1 local_130 [8];
  EnumValueData rc;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
  *__range1;
  _Self local_60 [3];
  allocator<char> local_41;
  key_type local_40;
  _Self local_20;
  const_iterator resultIt;
  VulkanHppGenerator *this_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *resultCodes;
  
  resultIt._M_node = (_Base_ptr)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"VkResult",&local_41);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
       ::find(&this->m_enums,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
       ::end(&this->m_enums);
  bVar1 = std::operator==(&local_20,local_60);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("resultIt != m_enums.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0x84f,"std::set<std::string> VulkanHppGenerator::gatherResultCodes() const");
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(__return_storage_ptr__);
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>
           ::operator->(&local_20);
  this_00 = &(ppVar2->second).values;
  __end1 = std::
           vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
           ::begin(this_00);
  rc._168_8_ = std::
               vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
               ::end(this_00);
  while (bVar1 = __gnu_cxx::
                 operator==<const_VulkanHppGenerator::EnumValueData_*,_std::vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>_>
                           (&__end1,(__normal_iterator<const_VulkanHppGenerator::EnumValueData_*,_std::vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>_>
                                     *)&rc.xmlLine), ((bVar1 ^ 0xffU) & 1) != 0) {
    pEVar3 = __gnu_cxx::
             __normal_iterator<const_VulkanHppGenerator::EnumValueData_*,_std::vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>_>
             ::operator*(&__end1);
    EnumValueData::EnumValueData((EnumValueData *)local_130,pEVar3);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(__return_storage_ptr__,(value_type *)&rc.deprecated);
    __end2 = std::
             vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
             ::begin((vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                      *)local_130);
    ac._96_8_ = std::
                vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                ::end((vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>
                       *)local_130);
    while (bVar1 = __gnu_cxx::
                   operator==<VulkanHppGenerator::EnumValueAlias_*,_std::vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>_>
                             (&__end2,(__normal_iterator<VulkanHppGenerator::EnumValueAlias_*,_std::vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>_>
                                       *)&ac.supported), ((bVar1 ^ 0xffU) & 1) != 0) {
      pEVar4 = __gnu_cxx::
               __normal_iterator<VulkanHppGenerator::EnumValueAlias_*,_std::vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>_>
               ::operator*(&__end2);
      EnumValueAlias::EnumValueAlias((EnumValueAlias *)local_1c0,pEVar4);
      pVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(__return_storage_ptr__,(value_type *)((long)&ac.alias.field_2 + 8));
      local_1e0.field_2._M_allocated_capacity = (size_type)pVar5.first._M_node;
      local_1e0.field_2._M_local_buf[8] = pVar5.second;
      EnumValueAlias::~EnumValueAlias((EnumValueAlias *)local_1c0);
      __gnu_cxx::
      __normal_iterator<VulkanHppGenerator::EnumValueAlias_*,_std::vector<VulkanHppGenerator::EnumValueAlias,_std::allocator<VulkanHppGenerator::EnumValueAlias>_>_>
      ::operator++(&__end2);
    }
    EnumValueData::~EnumValueData((EnumValueData *)local_130);
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::EnumValueData_*,_std::vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::operator==(&this->m_api,"vulkansc");
  if (bVar1) {
    local_288 = &local_280;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"VK_ERROR_FRAGMENTATION_EXT",&local_289);
    local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_260,"VK_ERROR_INVALID_EXTERNAL_HANDLE_KHR",&local_28a);
    local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_240,"VK_ERROR_INVALID_OPAQUE_CAPTURE_ADDRESS_KHR",&local_28b);
    local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_220,"VK_ERROR_NOT_PERMITTED_EXT",&local_28c);
    local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_200,"VK_PIPELINE_COMPILE_REQUIRED_EXT",&local_28d);
    local_1e0._M_dataplus._M_p = (pointer)&local_280;
    local_1e0._M_string_length = 5;
    __l._M_len = 5;
    __l._M_array = (iterator)local_1e0._M_dataplus._M_p;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(__return_storage_ptr__,__l);
    local_338 = &local_1e0;
    do {
      local_338 = local_338 + -1;
      std::__cxx11::string::~string((string *)local_338);
    } while (local_338 != &local_280);
    std::allocator<char>::~allocator(&local_28d);
    std::allocator<char>::~allocator(&local_28c);
    std::allocator<char>::~allocator(&local_28b);
    std::allocator<char>::~allocator(&local_28a);
    std::allocator<char>::~allocator(&local_289);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> VulkanHppGenerator::gatherResultCodes() const
{
  auto resultIt = m_enums.find( "VkResult" );
  assert( resultIt != m_enums.end() );
  std::set<std::string> resultCodes;
  for ( auto rc : resultIt->second.values )
  {
    resultCodes.insert( rc.name );
    for ( auto ac : rc.aliases )
    {
      resultCodes.insert( ac.name );
    }
  }
  // some special handling needed for vulkansc!!
  if ( m_api == "vulkansc" )
  {
    resultCodes.insert( { "VK_ERROR_FRAGMENTATION_EXT",
                          "VK_ERROR_INVALID_EXTERNAL_HANDLE_KHR",
                          "VK_ERROR_INVALID_OPAQUE_CAPTURE_ADDRESS_KHR",
                          "VK_ERROR_NOT_PERMITTED_EXT",
                          "VK_PIPELINE_COMPILE_REQUIRED_EXT" } );
  }
  return resultCodes;
}